

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O2

ZCC_OpProto * __thiscall
ZCC_OpInfoType::FindBestProto(ZCC_OpInfoType *this,PType *optype,Conversion **route,int *numslots)

{
  uint uVar1;
  ulong uVar2;
  ZCC_OpProto *pZVar3;
  Conversion *(*slots) [8];
  uint uVar4;
  Conversion *(*local_d8) [8];
  ZCC_OpProto *local_c8;
  Conversion *routes [2] [8];
  
  if (optype == (PType *)0x0) {
    __assert_fail("optype != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/zscript/zcc_expr.cpp"
                  ,0x79,
                  "ZCC_OpProto *ZCC_OpInfoType::FindBestProto(PType *, const PType::Conversion **, int &)"
                 );
  }
  pZVar3 = (ZCC_OpProto *)&this->Protos;
  uVar2 = 0;
  local_c8 = (ZCC_OpProto *)0x0;
  local_d8 = (Conversion *(*) [8])0x0;
  uVar4 = 0x7fffffff;
  do {
    slots = routes + uVar2;
    do {
      do {
        if ((uVar4 == 0) || (pZVar3 = pZVar3->Next, pZVar3 == (ZCC_OpProto *)0x0)) {
          if ((route != (Conversion **)0x0) &&
             ((local_d8 != (Conversion *(*) [8])0x0 && (uVar1 = *numslots, 0 < (int)uVar1)))) {
            if ((int)uVar4 <= (int)uVar1) {
              uVar1 = uVar4;
            }
            *numslots = uVar1;
            if (0 < (int)uVar4) {
              memcpy(route,local_d8,(ulong)uVar1 << 3);
            }
          }
          return local_c8;
        }
      } while (pZVar3->Type2 != (PType *)0x0);
      uVar1 = PType::FindConversion(optype,pZVar3->Type1,*slots,8);
    } while ((int)uVar4 <= (int)uVar1 || (int)uVar1 < 0);
    uVar2 = (ulong)((uint)uVar2 ^ 1);
    uVar4 = uVar1;
    local_d8 = slots;
    local_c8 = pZVar3;
  } while( true );
}

Assistant:

ZCC_OpProto *ZCC_OpInfoType::FindBestProto(PType *optype, const PType::Conversion **route, int &numslots)
{
	assert(optype != NULL);

	const PType::Conversion *routes[2][CONVERSION_ROUTE_SIZE];
	const PType::Conversion **best_route = NULL;
	int cur_route = 0;
	ZCC_OpProto *best_proto = NULL;
	int best_dist = INT_MAX;

	// Find the best prototype.
	for (ZCC_OpProto *proto = Protos; best_dist != 0 && proto != NULL; proto = proto->Next)
	{
		if (proto->Type2 != NULL)
		{ // Not a unary prototype.
			continue;
		}
		int dist = optype->FindConversion(proto->Type1, routes[cur_route], CONVERSION_ROUTE_SIZE);
		if (dist >= 0 && dist < best_dist)
		{
			best_dist = dist;
			best_proto = proto;
			best_route = routes[cur_route];
			cur_route ^= 1;
		}
	}
	// Copy best conversion route to the caller's array.
	if (best_route != NULL && route != NULL && numslots > 0)
	{
		numslots = MIN(numslots, best_dist);
		if (numslots > 0)
		{
			memcpy(route, best_route, sizeof(*route) * numslots);
		}
	}
	return best_proto;
}